

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

int Potassco::xconvert(char *x,string *out,char **errPos,int sep)

{
  char *pcVar1;
  
  if (sep != 0) {
    pcVar1 = strchr(x,(int)(char)sep);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::assign((char *)out,(ulong)x);
      goto LAB_00192d2f;
    }
  }
  std::__cxx11::string::assign((char *)out);
LAB_00192d2f:
  if (errPos != (char **)0x0) {
    *errPos = x + out->_M_string_length;
  }
  return 1;
}

Assistant:

int xconvert(const char* x, string& out, const char** errPos, int sep) {
	const char* end;
	if (sep == 0 || (end = strchr(x, char(sep))) == 0) {
		out = x;
	}
	else {
		out.assign(x, end - x);
	}
	if (errPos) { *errPos = x + out.length(); }
	return 1;
}